

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

timestamp_t __thiscall
duckdb::WindowQuantileState<duckdb::timestamp_t>::WindowScalar<duckdb::timestamp_t,false>
          (WindowQuantileState<duckdb::timestamp_t> *this,CursorType *data,SubFrames *frames,idx_t n
          ,Vector *result,QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  InternalException *this_01;
  QuantileCursor<duckdb::timestamp_t> *in_RDI;
  IndexError *idx_err;
  array<duckdb::timestamp_t,_2UL> dest;
  Interpolator<false> interp;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true> *in_stack_fffffffffffffee0;
  Vector *in_stack_fffffffffffffee8;
  allocator *paVar5;
  Interpolator<false> *in_stack_fffffffffffffef0;
  Interpolator<false> *in_stack_fffffffffffffef8;
  HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
  *in_stack_ffffffffffffff00;
  QuantileValue *in_stack_ffffffffffffff20;
  Vector *in_stack_ffffffffffffff28;
  idx_t in_stack_ffffffffffffff30;
  SubFrames *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  allocator in_stack_ffffffffffffff4f;
  string local_b0 [168];
  int64_t local_8;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0x1d7abf9);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffee0);
    local_8 = (int64_t)QuantileSortTree::WindowScalar<duckdb::timestamp_t,duckdb::timestamp_t,false>
                                 ((QuantileSortTree *)
                                  CONCAT17(in_stack_ffffffffffffff4f,
                                           CONCAT16(in_stack_ffffffffffffff4e,
                                                    in_stack_ffffffffffffff48)),in_RDI,
                                  in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                  in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
                        *)0x1d7ac54);
    if (!bVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar5 = (allocator *)&stack0xffffffffffffff4f;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b0,"No accelerator for scalar QUANTILE",paVar5);
      InternalException::InternalException
                (this_01,(string *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>,_true>
                            *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
    ::size(this_00);
    Interpolator<false>::Interpolator
              (in_stack_fffffffffffffef0,(QuantileValue *)in_stack_fffffffffffffee8,
               (idx_t)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>,_true>
                  *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
    ::at(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
         (size_t)in_stack_fffffffffffffef0,
         (vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
          *)in_stack_fffffffffffffee8);
    pvVar2 = vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true>::operator[]
                       (in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    pvVar3 = ::std::array<duckdb::timestamp_t,_2UL>::operator[]
                       ((array<duckdb::timestamp_t,_2UL> *)in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    pvVar3->value = (pvVar2->second).value;
    sVar4 = ::std::
            vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
            ::size((vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
                    *)&(in_RDI->scan).current_chunk_state.handles._M_h._M_rehash_policy);
    if (sVar4 < 2) {
      in_stack_fffffffffffffef8 =
           (Interpolator<false> *)
           vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true>::operator[]
                     (in_stack_fffffffffffffee0,
                      CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      pvVar3 = ::std::array<duckdb::timestamp_t,_2UL>::operator[]
                         ((array<duckdb::timestamp_t,_2UL> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      pvVar3->value = ((timestamp_t *)&in_stack_fffffffffffffef8->RN)->value;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true>::operator[]
                         (in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      pvVar3 = ::std::array<duckdb::timestamp_t,_2UL>::operator[]
                         ((array<duckdb::timestamp_t,_2UL> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      pvVar3->value = (pvVar2->second).value;
    }
    ::std::array<duckdb::timestamp_t,_2UL>::data((array<duckdb::timestamp_t,_2UL> *)0x1d7ae44);
    local_8 = (int64_t)Interpolator<false>::Extract<duckdb::timestamp_t,duckdb::timestamp_t>
                                 (in_stack_fffffffffffffef8,(timestamp_t *)in_stack_fffffffffffffef0
                                  ,in_stack_fffffffffffffee8);
  }
  return (timestamp_t)local_8;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}